

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

Color * __thiscall
World::getRadiance(Color *__return_storage_ptr__,World *this,Vector3 *P,Vector3 *N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  Vector3 O;
  double local_80;
  double local_68;
  Vector3 local_60;
  Vector3 local_48;
  
  iVar1 = this->SHADE_QUALITY;
  local_80 = 0.0;
  for (iVar3 = -iVar1; iVar3 <= iVar1; iVar3 = iVar3 + 1) {
    for (iVar2 = -iVar1; iVar2 <= iVar1; iVar2 = iVar2 + 1) {
      Light::getPos(&local_60,this->light,(double)iVar3 / (double)iVar1,
                    (double)iVar2 / (double)iVar1);
      dVar4 = getRadianceWithLight(this,P,N,&local_60);
      local_80 = local_80 + dVar4;
      iVar1 = this->SHADE_QUALITY;
    }
  }
  local_48.x = (double)(iVar1 * 2 + 1);
  local_48.x = (local_80 / local_48.x) / local_48.x;
  local_48.y = local_48.x;
  local_48.z = local_48.x;
  operator*(&local_48,&this->light->color);
  local_68 = Vector3::power(&this->light->color);
  operator/(&local_60,&local_68);
  return __return_storage_ptr__;
}

Assistant:

Color World::getRadiance(const Vector3 &P, const Vector3 &N)
{
    double res = 0;
    for (int i = -SHADE_QUALITY; i <= SHADE_QUALITY; ++i) {
        for (int j = -SHADE_QUALITY; j <= SHADE_QUALITY; ++j) {
            Vector3 O = light->getPos(i*1.0/SHADE_QUALITY, j*1.0/SHADE_QUALITY);
            res += getRadianceWithLight(P, N, O);
        }
    }
    return res / (2 * SHADE_QUALITY + 1) / (2 * SHADE_QUALITY + 1) * light->color / light->color.power();
}